

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_kill(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  unsigned_long uVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int64_t eval_a;
  int64_t eval_b;
  sigset_t set;
  
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset((sigset_t *)&set);
  sigaddset((sigset_t *)&set,0xf);
  iVar1 = pthread_sigmask(0,(sigset_t *)&set,(__sigset_t *)0x0);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    set.__val[0] = 0xffffffffffffffff;
    eval_a = (int64_t)signal(0xf,(__sighandler_t)0x1);
    if (set.__val[0] == eval_a) {
      pcVar6 = "!=";
      pcVar7 = "signal(15, ((__sighandler_t) 1))";
      pcVar5 = "((__sighandler_t) -1)";
      uVar4 = 0x41d;
      uVar3 = set.__val[0];
      goto LAB_00177262;
    }
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    uVar3 = (unsigned_long)iVar1;
    eval_a = 0;
    set.__val[0] = uVar3;
    if (uVar3 != 0) {
      pcVar6 = "==";
      pcVar7 = "0";
      pcVar5 = "r";
      uVar4 = 0x421;
      goto LAB_00177262;
    }
    sigemptyset((sigset_t *)&set);
    sigaddset((sigset_t *)&set,0xf);
    iVar1 = pthread_sigmask(1,(sigset_t *)&set,(__sigset_t *)0x0);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      set.__val[0] = 0xffffffffffffffff;
      eval_a = (int64_t)signal(0xf,(__sighandler_t)0x0);
      if (set.__val[0] == eval_a) {
        pcVar6 = "!=";
        pcVar7 = "signal(15, ((__sighandler_t) 0))";
        pcVar5 = "((__sighandler_t) -1)";
        uVar4 = 0x42a;
        uVar3 = set.__val[0];
      }
      else {
        iVar1 = uv_kill(process.pid,0);
        uVar3 = (unsigned_long)iVar1;
        eval_a = 0;
        set.__val[0] = uVar3;
        if (uVar3 == 0) {
          iVar1 = uv_kill(process.pid,0xf);
          uVar3 = (unsigned_long)iVar1;
          eval_a = 0;
          set.__val[0] = uVar3;
          if (uVar3 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
            uVar3 = (unsigned_long)iVar1;
            eval_a = 0;
            if (uVar3 == 0) {
              set.__val[0] = 1;
              eval_a = (int64_t)exit_cb_called;
              if ((__sighandler_t)eval_a == (__sighandler_t)0x1) {
                set.__val[0] = 1;
                eval_a = (int64_t)close_cb_called;
                if ((__sighandler_t)eval_a == (__sighandler_t)0x1) {
                  puVar2 = uv_default_loop();
                  close_loop(puVar2);
                  set.__val[0] = 0;
                  puVar2 = uv_default_loop();
                  iVar1 = uv_loop_close(puVar2);
                  eval_a = (int64_t)iVar1;
                  if (set.__val[0] == eval_a) {
                    uv_library_shutdown();
                    return 0;
                  }
                  pcVar6 = "==";
                  pcVar7 = "uv_loop_close(uv_default_loop())";
                  pcVar5 = "0";
                  uVar4 = 0x43d;
                  uVar3 = set.__val[0];
                }
                else {
                  pcVar6 = "==";
                  pcVar7 = "close_cb_called";
                  pcVar5 = "1";
                  uVar4 = 0x43b;
                  uVar3 = set.__val[0];
                }
              }
              else {
                pcVar6 = "==";
                pcVar7 = "exit_cb_called";
                pcVar5 = "1";
                uVar4 = 0x43a;
                uVar3 = set.__val[0];
              }
            }
            else {
              pcVar6 = "==";
              pcVar7 = "0";
              pcVar5 = "r";
              uVar4 = 0x438;
              set.__val[0] = uVar3;
            }
          }
          else {
            pcVar6 = "==";
            pcVar7 = "0";
            pcVar5 = "r";
            uVar4 = 0x435;
          }
        }
        else {
          pcVar6 = "==";
          pcVar7 = "0";
          pcVar5 = "r";
          uVar4 = 0x431;
        }
      }
      goto LAB_00177262;
    }
    pcVar5 = "pthread_sigmask(1, &set, ((void*)0))";
    uVar4 = 0x428;
  }
  else {
    pcVar5 = "pthread_sigmask(0, &set, ((void*)0))";
    uVar4 = 0x41b;
  }
  pcVar7 = "0";
  pcVar6 = "==";
  uVar3 = eval_a;
  eval_a = (int64_t)(__sighandler_t)0x0;
LAB_00177262:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar4,pcVar5,pcVar6,pcVar7,uVar3,pcVar6,eval_a);
  abort();
}

Assistant:

TEST_IMPL(kill) {
  int r;

#ifdef _WIN32
  no_term_signal = 1;
#endif

  init_process_options("spawn_helper4", kill_cb);

  /* Verify that uv_spawn() resets the signal disposition. */
#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_BLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_IGN));
#endif

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

#ifndef _WIN32
  {
    sigset_t set;
    sigemptyset(&set);
    sigaddset(&set, SIGTERM);
    ASSERT_OK(pthread_sigmask(SIG_UNBLOCK, &set, NULL));
  }
  ASSERT_NE(SIG_ERR, signal(SIGTERM, SIG_DFL));
#endif

  /* Sending signum == 0 should check if the
   * child process is still alive, not kill it.
   */
  r = uv_kill(process.pid, 0);
  ASSERT_OK(r);

  /* Kill the process. */
  r = uv_kill(process.pid, SIGTERM);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}